

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

size_t __thiscall
pugi::xpath_query::evaluate_string(xpath_query *this,char_t *buffer,size_t capacity,xpath_node *n)

{
  undefined8 *puVar1;
  size_t sVar2;
  ulong uVar3;
  xpath_string r;
  xpath_context c;
  xpath_stack_data sd;
  
  c.n._node._root = (n->_node)._root;
  c.n._attribute._attr = (n->_attribute)._attr;
  sd.result._error = &sd.oom;
  sd.result._root = sd.blocks;
  sd.stack.temp = &sd.temp;
  sd.temp._root = sd.blocks + 1;
  c.position = 1;
  c.size = 1;
  sd.stack.result = &sd.result;
  sd.result._root_size = 0;
  sd.temp._root_size = 0;
  sd.oom = false;
  sd.blocks[1].next = (xpath_memory_block *)0x0;
  sd.blocks[0].next = (xpath_memory_block *)0x0;
  sd.blocks[1].capacity = 0x1000;
  sd.blocks[0].capacity = 0x1000;
  sd.temp._error = sd.result._error;
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    r._buffer = "";
    r._uses_heap = false;
    r._length_heap = 0;
  }
  else {
    impl::anon_unknown_0::xpath_ast_node::eval_string(&r,*this->_impl,&c,&sd.stack);
    if ((sd.oom & 1U) != 0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = clock_gettime;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  sVar2 = impl::anon_unknown_0::xpath_string::length(&r);
  uVar3 = sVar2 + 1;
  if (capacity != 0) {
    if (uVar3 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x31b9,
                    "size_t pugi::xpath_query::evaluate_string(char_t *, size_t, const xpath_node &) const"
                   );
    }
    if (uVar3 < capacity) {
      capacity = uVar3;
    }
    memcpy(buffer,r._buffer,capacity - 1);
    buffer[capacity - 1] = '\0';
  }
  impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&sd);
  return uVar3;
}

Assistant:

PUGI__FN size_t xpath_query::evaluate_string(char_t* buffer, size_t capacity, const xpath_node& n) const
	{
		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = _impl ? static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack) : impl::xpath_string();

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			r = impl::xpath_string();
		#else
			throw std::bad_alloc();
		#endif
		}

		size_t full_size = r.length() + 1;

		if (capacity > 0)
		{
			size_t size = (full_size < capacity) ? full_size : capacity;
			assert(size > 0);

			memcpy(buffer, r.c_str(), (size - 1) * sizeof(char_t));
			buffer[size - 1] = 0;
		}

		return full_size;
	}